

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.cpp
# Opt level: O2

string * __thiscall
Jupiter::Socket::resolveAddress_abi_cxx11_
          (string *__return_storage_ptr__,Socket *this,addrinfo *addr,uint result)

{
  addrinfo *this_00;
  undefined4 extraout_EDX;
  undefined4 extraout_var;
  
  this_00 = getAddrInfo((addrinfo *)this,(uint)addr);
  if (this_00 == (addrinfo *)0x0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  else {
    resolveAddress_abi_cxx11_
              (__return_storage_ptr__,(Socket *)this_00,
               (addrinfo *)CONCAT44(extraout_var,extraout_EDX));
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Jupiter::Socket::resolveAddress(addrinfo *addr, unsigned int result) { // static
	addrinfo *ptr = Jupiter::Socket::getAddrInfo(addr, result);
	if (ptr == nullptr) {
		return {};
	}

	return Jupiter::Socket::resolveAddress(ptr);
}